

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsUtils.cpp
# Opt level: O0

int Js::GetStackSizeForAsmJsUnboxing(ScriptFunction *func)

{
  ArgSlot AVar1;
  FunctionBody *this;
  AsmJsFunctionInfo *this_00;
  ScriptContext *pSVar2;
  ThreadContext *this_01;
  undefined4 local_1c;
  int argSize;
  AsmJsFunctionInfo *info;
  ScriptFunction *func_local;
  
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  this_00 = FunctionBody::GetAsmJsFunctionInfo(this);
  AVar1 = AsmJsFunctionInfo::GetArgByteSize(this_00);
  local_1c = ::Math::Align<int>(AVar1 + 8,0x10);
  if (local_1c < 0x20) {
    local_1c = 0x20;
  }
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)func);
  this_01 = ScriptContext::GetThreadContext(pSVar2);
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)func);
  ThreadContext::ProbeStack(this_01,(ulong)(local_1c + 0xc00),(RecyclableObject *)func,pSVar2);
  return local_1c;
}

Assistant:

int GetStackSizeForAsmJsUnboxing(ScriptFunction* func)
    {
        AsmJsFunctionInfo* info = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        int argSize = info->GetArgByteSize() + MachPtr;
        argSize = ::Math::Align<int32>(argSize, 16);

        if (argSize < 32)
        {
            argSize = 32; // convention is to always allocate spill space for rcx,rdx,r8,r9
        }

        PROBE_STACK_CALL(func->GetScriptContext(), func, argSize + Js::Constants::MinStackDefault);
        return argSize;
    }